

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRType * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRType>::allocate<>(ObjectPool<spirv_cross::SPIRType> *this)

{
  Vector<spirv_cross::SPIRType_*> *this_00;
  SPIRType *pSVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  SPIRType *ptr;
  SPIRType *local_40;
  SPIRType *local_38;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
  if (sVar2 == 0) {
    uVar3 = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRType,_spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRType *)malloc(uVar3 * 0x150);
    if (pSVar1 == (SPIRType *)0x0) {
      return (SPIRType *)0x0;
    }
    local_38 = pSVar1;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      local_40 = pSVar1;
      SmallVector<spirv_cross::SPIRType_*,_0UL>::push_back(this_00,&local_40);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRType,spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRType*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRType,spirv_cross::ObjectPool<spirv_cross::SPIRType>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRType_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRType_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRType_*,_0UL>::pop_back(this_00);
  memset(pSVar1,0,0x150);
  SPIRType::SPIRType(pSVar1);
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}